

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void C_RestoreCVars(void)

{
  long lVar1;
  ulong uVar2;
  
  if (CVarBackups.Count != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      cvar_set(*(char **)((long)CVarBackups.Array + lVar1 + -8),
               *(char **)((long)&((CVarBackups.Array)->Name).Chars + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < CVarBackups.Count);
  }
  if (CVarBackups.Count != 0) {
    TArray<FCVarBackup,_FCVarBackup>::DoDelete(&CVarBackups,0,CVarBackups.Count - 1);
    CVarBackups.Count = 0;
  }
  return;
}

Assistant:

UCVarValue FBaseCVar::FromFloat (float value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value != 0.f;
		break;

	case CVAR_Int:
		ret.Int = (int)value;
		break;

	case CVAR_Float:
		ret.Float = value;
		break;

	case CVAR_String:
		IGNORE_FORMAT_PRE
		mysnprintf (cstrbuf, countof(cstrbuf), "%H", value);
		IGNORE_FORMAT_POST
		ret.String = cstrbuf;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}